

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O3

Amap_Nod_t * Amap_LibCreateObj(Amap_Lib_t *p)

{
  Amap_Nod_t *pAVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Amap_Nod_t *__ptr;
  undefined8 *puVar5;
  void *pvVar6;
  void **ppvVar7;
  int iVar8;
  
  iVar8 = p->nNodes;
  __ptr = p->pNodes;
  if (iVar8 == p->nNodesAlloc) {
    if (__ptr == (Amap_Nod_t *)0x0) {
      __ptr = (Amap_Nod_t *)malloc((long)iVar8 * 0x30);
      iVar2 = iVar8;
    }
    else {
      __ptr = (Amap_Nod_t *)realloc(__ptr,(long)iVar8 * 0x30);
      iVar8 = p->nNodes;
      iVar2 = p->nNodesAlloc;
    }
    p->pNodes = __ptr;
    p->nNodesAlloc = iVar2 * 2;
  }
  pAVar1 = __ptr + iVar8;
  *(undefined8 *)pAVar1 = 0;
  pAVar1->iFan2 = 0;
  pAVar1->Unused = 0;
  *(undefined4 *)&pAVar1->field_0xc = 0;
  __ptr[iVar8].pSets = (Amap_Set_t *)0x0;
  iVar2 = p->nNodes;
  p->nNodes = iVar2 + 1;
  *(short *)(__ptr + iVar8) = (short)iVar2;
  pVVar4 = p->vRules;
  puVar5 = (undefined8 *)malloc(0x10);
  *puVar5 = 0x10;
  pvVar6 = malloc(0x40);
  puVar5[1] = pvVar6;
  uVar3 = pVVar4->nSize;
  if (uVar3 == pVVar4->nCap) {
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = 0x10;
    }
    else {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = uVar3 * 2;
    }
  }
  else {
    ppvVar7 = pVVar4->pArray;
  }
  iVar2 = pVVar4->nSize;
  pVVar4->nSize = iVar2 + 1;
  ppvVar7[iVar2] = puVar5;
  pVVar4 = p->vRules;
  puVar5 = (undefined8 *)malloc(0x10);
  *puVar5 = 0x10;
  pvVar6 = malloc(0x40);
  puVar5[1] = pvVar6;
  uVar3 = pVVar4->nSize;
  if (uVar3 == pVVar4->nCap) {
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = 0x10;
    }
    else {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = uVar3 * 2;
    }
  }
  else {
    ppvVar7 = pVVar4->pArray;
  }
  iVar2 = pVVar4->nSize;
  pVVar4->nSize = iVar2 + 1;
  ppvVar7[iVar2] = puVar5;
  pVVar4 = p->vRulesX;
  puVar5 = (undefined8 *)malloc(0x10);
  *puVar5 = 0x10;
  pvVar6 = malloc(0x40);
  puVar5[1] = pvVar6;
  uVar3 = pVVar4->nSize;
  if (uVar3 == pVVar4->nCap) {
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = 0x10;
    }
    else {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = uVar3 * 2;
    }
  }
  else {
    ppvVar7 = pVVar4->pArray;
  }
  iVar2 = pVVar4->nSize;
  pVVar4->nSize = iVar2 + 1;
  ppvVar7[iVar2] = puVar5;
  pVVar4 = p->vRulesX;
  puVar5 = (undefined8 *)malloc(0x10);
  *puVar5 = 0x10;
  pvVar6 = malloc(0x40);
  puVar5[1] = pvVar6;
  uVar3 = pVVar4->nSize;
  if (uVar3 == pVVar4->nCap) {
    if ((int)uVar3 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = 0x10;
    }
    else {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
      }
      pVVar4->pArray = ppvVar7;
      pVVar4->nCap = uVar3 * 2;
    }
  }
  else {
    ppvVar7 = pVVar4->pArray;
  }
  iVar2 = pVVar4->nSize;
  pVVar4->nSize = iVar2 + 1;
  ppvVar7[iVar2] = puVar5;
  return __ptr + iVar8;
}

Assistant:

Amap_Nod_t * Amap_LibCreateObj( Amap_Lib_t * p )
{
    Amap_Nod_t * pNode;
    if ( p->nNodes == p->nNodesAlloc )
    {
        p->pNodes = ABC_REALLOC( Amap_Nod_t, p->pNodes, 2*p->nNodesAlloc );
        p->nNodesAlloc *= 2;
    }
    pNode = Amap_LibNod( p, p->nNodes );
    memset( pNode, 0, sizeof(Amap_Nod_t) );
    pNode->Id = p->nNodes++;
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRules, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    Vec_PtrPush( p->vRulesX, Vec_IntAlloc(8) );
    return pNode;
}